

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O0

void __thiscall pfd::settings::settings(settings *this,bool resync)

{
  bool bVar1;
  bool *pbVar2;
  bool local_1a3;
  bool local_191;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  byte local_f3;
  byte local_f2;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  char *local_d0;
  char *desktop_name;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  settings *psStack_10;
  bool resync_local;
  settings *this_local;
  
  local_11 = resync;
  psStack_10 = this;
  pbVar2 = flags(this,is_scanned);
  *pbVar2 = (*pbVar2 & 1U & (resync ^ 0xffU) & 1) != 0;
  pbVar2 = flags(this,is_scanned);
  if ((*pbVar2 & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"zenity",&local_39);
    bVar1 = check_program(this,&local_38);
    pbVar2 = flags(this,has_zenity);
    *pbVar2 = bVar1;
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"matedialog",&local_71);
    bVar1 = check_program(this,&local_70);
    pbVar2 = flags(this,has_matedialog);
    *pbVar2 = bVar1;
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"qarma",&local_99);
    bVar1 = check_program(this,&local_98);
    pbVar2 = flags(this,has_qarma);
    *pbVar2 = bVar1;
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"kdialog",(allocator<char> *)((long)&desktop_name + 7));
    bVar1 = check_program(this,&local_c0);
    pbVar2 = flags(this,has_kdialog);
    *pbVar2 = bVar1;
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&desktop_name + 7));
    pbVar2 = flags(this,has_zenity);
    if (((*pbVar2 & 1U) != 0) && (pbVar2 = flags(this,has_kdialog), (*pbVar2 & 1U) != 0)) {
      local_d0 = getenv("XDG_SESSION_DESKTOP");
      local_f2 = 0;
      local_f3 = 0;
      local_191 = false;
      if (local_d0 != (char *)0x0) {
        std::allocator<char>::allocator();
        local_f2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"gnome",&local_f1);
        local_f3 = 1;
        local_191 = std::operator==(&local_f0,local_d0);
      }
      if ((local_f3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_f0);
      }
      if ((local_f2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_f1);
      }
      if (local_191 == false) {
        local_1a3 = false;
        if (local_d0 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"KDE",&local_119);
          local_1a3 = std::operator==(&local_118,local_d0);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator(&local_119);
        }
        if (local_1a3 != false) {
          pbVar2 = flags(this,has_zenity);
          *pbVar2 = false;
        }
      }
      else {
        pbVar2 = flags(this,has_kdialog);
        *pbVar2 = false;
      }
    }
    pbVar2 = flags(this,is_scanned);
    *pbVar2 = true;
  }
  return;
}

Assistant:

inline settings::settings(bool resync)
{
    flags(flag::is_scanned) &= !resync;

    if (flags(flag::is_scanned))
        return;

#if _WIN32
    flags(flag::is_vista) = internal::is_vista();
#elif !__APPLE__
    flags(flag::has_zenity) = check_program("zenity");
    flags(flag::has_matedialog) = check_program("matedialog");
    flags(flag::has_qarma) = check_program("qarma");
    flags(flag::has_kdialog) = check_program("kdialog");

    // If multiple helpers are available, try to default to the best one
    if (flags(flag::has_zenity) && flags(flag::has_kdialog))
    {
        auto desktop_name = std::getenv("XDG_SESSION_DESKTOP");
        if (desktop_name && desktop_name == std::string("gnome"))
            flags(flag::has_kdialog) = false;
        else if (desktop_name && desktop_name == std::string("KDE"))
            flags(flag::has_zenity) = false;
    }
#endif

    flags(flag::is_scanned) = true;
}